

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::RetentionTest_Field_Test::TestBody
          (RetentionTest_Field_Test *this)

{
  OptionsMessage *options;
  Metadata MVar1;
  
  MVar1 = proto2_unittest::TopLevelMessage::GetMetadata
                    ((TopLevelMessage *)proto2_unittest::_TopLevelMessage_default_instance_);
  if (0 < (MVar1.descriptor)->field_count_) {
    options = (OptionsMessage *)
              ExtensionSet::GetMessage
                        (&((MVar1.descriptor)->fields_->options_->field_0)._impl_._extensions_,
                         proto2_unittest::field_option,
                         (MessageLite *)PTR__OptionsMessage_default_instance__019782e8);
    CheckOptionsMessageIsStrippedCorrectly(options);
    return;
  }
  internal::_GLOBAL__N_1::RetentionTest_Field_Test::TestBody();
}

Assistant:

TEST(RetentionTest, Field) {
  CheckOptionsMessageIsStrippedCorrectly(
      proto2_unittest::TopLevelMessage::descriptor()
          ->field(0)
          ->options()
          .GetExtension(proto2_unittest::field_option));
}